

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmMakefileTargetGenerator::GetLinkRule
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *linkRuleVar)

{
  pointer pcVar1;
  bool bVar2;
  string *psVar3;
  char *pcVar4;
  string ruleVar;
  string local_68;
  string local_48;
  
  psVar3 = cmMakefile::GetRequiredDefinition
                     ((this->super_cmCommonTargetGenerator).Makefile,linkRuleVar);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar3->_M_string_length);
  psVar3 = &(this->super_cmCommonTargetGenerator).ConfigName;
  bVar2 = cmGeneratorTarget::HasImplibGNUtoMS
                    ((this->super_cmCommonTargetGenerator).GeneratorTarget,psVar3);
  if (bVar2) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CMAKE_","");
    cmGeneratorTarget::GetLinkerLanguage
              (&local_48,(this->super_cmCommonTargetGenerator).GeneratorTarget,psVar3);
    std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_68);
    pcVar4 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&local_68);
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetLinkRule(
  const std::string& linkRuleVar)
{
  std::string linkRule = this->Makefile->GetRequiredDefinition(linkRuleVar);
  if (this->GeneratorTarget->HasImplibGNUtoMS(this->ConfigName)) {
    std::string ruleVar = "CMAKE_";
    ruleVar += this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
    ruleVar += "_GNUtoMS_RULE";
    if (const char* rule = this->Makefile->GetDefinition(ruleVar)) {
      linkRule += rule;
    }
  }
  return linkRule;
}